

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JoystickImpl.cpp
# Opt level: O0

int __thiscall sf::priv::JoystickImpl::open(JoystickImpl *this,char *__file,int __oflag,...)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  reference pvVar4;
  reference pvVar5;
  char *__file_00;
  ostream *poVar6;
  int *piVar7;
  void *this_00;
  uint uStack000000000000004c;
  undefined8 in_stack_00000048;
  string devnode;
  String *in_stack_fffffffffffffec8;
  JoystickState *in_stack_fffffffffffffed0;
  undefined4 in_stack_ffffffffffffff10;
  undefined1 local_d4 [68];
  locale local_90 [8];
  string local_88 [8];
  uint in_stack_ffffffffffffff80;
  string local_38 [36];
  uint local_14;
  JoystickImpl *local_10;
  undefined1 local_1;
  
  uStack000000000000004c = (uint)((ulong)in_stack_00000048 >> 0x20);
  local_14 = (uint)__file;
  pvVar5 = (reference)((ulong)__file & 0xffffffff);
  local_10 = this;
  pvVar4 = (reference)
           std::
           vector<(anonymous_namespace)::JoystickRecord,_std::allocator<(anonymous_namespace)::JoystickRecord>_>
           ::size((vector<(anonymous_namespace)::JoystickRecord,_std::allocator<(anonymous_namespace)::JoystickRecord>_>
                   *)(anonymous_namespace)::joystickList);
  if (pvVar5 < pvVar4) {
    pvVar4 = pvVar5;
    pvVar5 = std::
             vector<(anonymous_namespace)::JoystickRecord,_std::allocator<(anonymous_namespace)::JoystickRecord>_>
             ::operator[]((vector<(anonymous_namespace)::JoystickRecord,_std::allocator<(anonymous_namespace)::JoystickRecord>_>
                           *)(anonymous_namespace)::joystickList,(ulong)local_14);
    if ((pvVar5->plugged & 1U) != 0) {
      pvVar5 = std::
               vector<(anonymous_namespace)::JoystickRecord,_std::allocator<(anonymous_namespace)::JoystickRecord>_>
               ::operator[]((vector<(anonymous_namespace)::JoystickRecord,_std::allocator<(anonymous_namespace)::JoystickRecord>_>
                             *)(anonymous_namespace)::joystickList,(ulong)local_14);
      std::__cxx11::string::string(local_38,(string *)pvVar5);
      __file_00 = (char *)std::__cxx11::string::c_str();
      iVar2 = ::open(__file_00,0x800);
      this->m_file = iVar2;
      if (this->m_file < 0) {
        poVar6 = err();
        poVar6 = std::operator<<(poVar6,"Failed to open joystick ");
        poVar6 = std::operator<<(poVar6,local_38);
        poVar6 = std::operator<<(poVar6,": ");
        piVar7 = __errno_location();
        this_00 = (void *)std::ostream::operator<<(poVar6,*piVar7);
        std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
        bVar1 = false;
      }
      else {
        ioctl(this->m_file,0x80406a32,this->m_mapping);
        (anonymous_namespace)::getJoystickName_abi_cxx11_(uStack000000000000004c);
        std::locale::locale(local_90);
        String::String((String *)pvVar4,(string *)this,
                       (locale *)CONCAT44(iVar2,in_stack_ffffffffffffff10));
        String::operator=((String *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
        String::~String((String *)0x258e04);
        std::locale::~locale(local_90);
        std::__cxx11::string::~string(local_88);
        if ((anonymous_namespace)::udevContext != 0) {
          uVar3 = anon_unknown.dwarf_19d33d::getJoystickVendorId(in_stack_ffffffffffffff80);
          (this->m_identification).vendorId = uVar3;
          uVar3 = anon_unknown.dwarf_19d33d::getJoystickProductId(in_stack_ffffffffffffff80);
          (this->m_identification).productId = uVar3;
        }
        JoystickState::JoystickState(in_stack_fffffffffffffed0);
        memcpy(&this->m_state,local_d4,0x44);
        local_1 = 1;
        bVar1 = true;
      }
      std::__cxx11::string::~string(local_38);
      pvVar5 = (reference)0x0;
      if (bVar1) goto LAB_00258fd4;
    }
    local_1 = 0;
  }
  else {
    local_1 = 0;
  }
LAB_00258fd4:
  return (uint)CONCAT71((int7)((ulong)pvVar5 >> 8),local_1) & 0xffffff01;
}

Assistant:

bool JoystickImpl::open(unsigned int index)
{
    if (index >= joystickList.size())
        return false;

    if (joystickList[index].plugged)
    {
        std::string devnode = joystickList[index].deviceNode;

        // Open the joystick's file descriptor (read-only and non-blocking)
        m_file = ::open(devnode.c_str(), O_RDONLY | O_NONBLOCK);
        if (m_file >= 0)
        {
            // Retrieve the axes mapping
            ioctl(m_file, JSIOCGAXMAP, m_mapping);

            // Get info
            m_identification.name = getJoystickName(index);

            if (udevContext)
            {
                m_identification.vendorId  = getJoystickVendorId(index);
                m_identification.productId = getJoystickProductId(index);
            }

            // Reset the joystick state
            m_state = JoystickState();

            return true;
        }
        else
        {
            err() << "Failed to open joystick " << devnode << ": " << errno << std::endl;
        }
    }

    return false;
}